

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O2

void __thiscall
cfd::core::ElementsConfidentialAddress::DecodeAddress
          (ElementsConfidentialAddress *this,string *confidential_address,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list)

{
  pointer key;
  pointer pcVar1;
  _Alloc_hider _Var2;
  CfdException *pCVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *wally_string;
  bool bVar4;
  pointer this_00;
  string *key_00;
  int ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  uint32_t prefix;
  char *output;
  ElementsConfidentialAddress *local_278;
  pointer local_270;
  char *local_268;
  CfdSourceLocation local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_data;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  local_230;
  string *local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_210;
  pointer local_208;
  string hrp;
  string address;
  Address local_1c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_278 = this;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_data,0x21,
             (allocator_type *)&local_1c0);
  address._M_dataplus._M_p = (pointer)&address.field_2;
  address._M_string_length = 0;
  address.field_2._M_local_buf[0] = '\0';
  output = (char *)0x0;
  local_298 = confidential_address;
  if (confidential_address->_M_string_length == 0) {
    local_1c0._0_8_ = "cfdcore_elements_address.cpp";
    local_1c0.witness_ver_ = 0x83;
    local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
    logger::warn<std::__cxx11::string_const&>
              ((CfdSourceLocation *)&local_1c0,
               "DecodeAddress error. confidential address empty. : address={}.",confidential_address
              );
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_1c0,"DecodeAddress confidential address empty.",(allocator *)&hrp);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1c0);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = -1;
  prefix = 0;
  hrp._M_dataplus._M_p = (pointer)&hrp.field_2;
  hrp._M_string_length = 0;
  hrp.field_2._M_local_buf[0] = '\0';
  this_00 = (prefix_list->
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_208 = (prefix_list->
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_210 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278->confidential_key_
  ;
  local_218 = (string *)&local_278->address_;
  bVar4 = false;
  do {
    if (this_00 == local_208) {
      if (bVar4) {
        local_1c0._0_8_ = "cfdcore_elements_address.cpp";
        local_1c0.witness_ver_ = 0xd8;
        local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
        logger::warn<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)&local_1c0,
                   "DecodeAddress error. ConfidentialAddress prefix not found. : address={}.",
                   local_298);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&local_1c0,"DecodeAddress confidential address prefix not found.",
                   (allocator *)&local_230);
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1c0);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_1c0._0_8_ = "cfdcore_elements_address.cpp";
      local_1c0.witness_ver_ = 0xe1;
      local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
      logger::warn<std::__cxx11::string_const&>
                ((CfdSourceLocation *)&local_1c0,
                 "DecodeAddress error. ConfidentialAddress prefix not registed. : address={}.",
                 local_298);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_1c0,"DecodeAddress confidential address prefix not registed.",
                 (allocator *)&local_230);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_1c0);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    GetBlindKeyPair();
    local_270 = local_230.
                super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (key_00 = &(local_230.
                    super__Vector_base<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                    ._M_impl.super__Vector_impl_data._M_start)->blinded_prefix_key;
        key = (pointer)(key_00 + -1), key != local_270;
        key_00 = (string *)&key_00[2]._M_string_length) {
      output = (char *)0x0;
      if (*(char *)&key_00[1]._M_dataplus._M_p != '\x01') {
        prefix = AddressFormatData::GetValue(this_00,key_00);
        ret = wally_confidential_addr_to_ec_public_key
                        ((local_298->_M_dataplus)._M_p,prefix,
                         pubkey_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (long)pubkey_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)pubkey_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        if (ret != 0) {
          local_1c0._0_8_ = "cfdcore_elements_address.cpp";
          local_1c0.witness_ver_ = 0xa9;
          local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
          logger::trace<int&,unsigned_int&>
                    ((CfdSourceLocation *)&local_1c0,"fail libwally. ret={} prefix={}",&ret,&prefix)
          ;
          local_1c0._0_8_ = "cfdcore_elements_address.cpp";
          local_1c0.witness_ver_ = 0xac;
          local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
          logger::trace<std::__cxx11::string_const&>
                    ((CfdSourceLocation *)&local_1c0,"confidential_address={}",local_298);
          goto LAB_001faace;
        }
LAB_001faadb:
        _Var2._M_p = hrp._M_dataplus._M_p;
        pcVar1 = (local_298->_M_dataplus)._M_p;
        if (*(char *)&key_00[1]._M_dataplus._M_p == '\x01') {
          AddressFormatData::GetString((string *)&local_1c0,this_00,(string *)key);
          ret = wally_confidential_addr_to_addr_segwit(pcVar1,_Var2._M_p,local_1c0._0_8_,&output);
          ::std::__cxx11::string::~string((string *)&local_1c0);
          wally_string = extraout_RDX;
          if (ret != 0) {
            local_260.filename = "cfdcore_elements_address.cpp";
            local_260.line = 0xb9;
            local_260.funcname = "DecodeAddress";
            AddressFormatData::GetString((string *)&local_1c0,this_00,(string *)key);
            local_268 = (char *)local_1c0._0_8_;
            logger::trace<int&,char_const*>
                      (&local_260,"fail libwally. ret={} prefix={}",&ret,&local_268);
            ::std::__cxx11::string::~string((string *)&local_1c0);
            wally_string = extraout_RDX_00;
LAB_001fabf0:
            if (ret != 0) goto LAB_001fabf9;
          }
        }
        else {
          ret = wally_confidential_addr_to_addr(pcVar1,prefix,&output);
          wally_string = extraout_RDX_01;
          if (ret != 0) {
            local_1c0._0_8_ = "cfdcore_elements_address.cpp";
            local_1c0.witness_ver_ = 0xc1;
            local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
            logger::trace<int&,unsigned_int&>
                      ((CfdSourceLocation *)&local_1c0,"fail libwally. ret={} prefix={}",&ret,
                       &prefix);
            wally_string = extraout_RDX_02;
            goto LAB_001fabf0;
          }
        }
        WallyUtil::ConvertStringAndFree_abi_cxx11_
                  ((string *)&local_1c0,(WallyUtil *)output,wally_string);
        ::std::__cxx11::string::operator=((string *)&address,(string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        core::Address::Address(&local_1c0,&address,this_00);
        core::Address::operator=(&local_278->unblinded_address_,&local_1c0);
        core::Address::~Address(&local_1c0);
        ByteData::ByteData((ByteData *)&local_48,&pubkey_data);
        Pubkey::Pubkey((Pubkey *)&local_1c0,(ByteData *)&local_48);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (local_210,&local_1c0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48)
        ;
        bVar4 = true;
        ::std::__cxx11::string::_M_assign(local_218);
        break;
      }
      AddressFormatData::GetString((string *)&local_1c0,this_00,key_00);
      ::std::__cxx11::string::operator=((string *)&hrp,(string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ret = wally_confidential_addr_segwit_to_ec_public_key
                      ((local_298->_M_dataplus)._M_p,hrp._M_dataplus._M_p,
                       pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)pubkey_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)pubkey_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      if (ret == 0) goto LAB_001faadb;
      local_1c0._0_8_ = "cfdcore_elements_address.cpp";
      local_1c0.witness_ver_ = 0x9c;
      local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
      logger::trace<int&,std::__cxx11::string&>
                ((CfdSourceLocation *)&local_1c0,"fail libwally. ret={} prefix={}",&ret,&hrp);
      local_1c0._0_8_ = "cfdcore_elements_address.cpp";
      local_1c0.witness_ver_ = 0x9e;
      local_1c0.address_._M_dataplus._M_p = "DecodeAddress";
      logger::trace<std::__cxx11::string_const&>
                ((CfdSourceLocation *)&local_1c0,"confidential_address={}",local_298);
LAB_001faace:
      if (ret == 0) goto LAB_001faadb;
LAB_001fabf9:
      bVar4 = true;
    }
    ::std::
    vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
    ::~vector(&local_230);
    this_00 = this_00 + 1;
    if (key != local_270) {
      ::std::__cxx11::string::~string((string *)&hrp);
      ::std::__cxx11::string::~string((string *)&address);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
  } while( true );
}

Assistant:

void ElementsConfidentialAddress::DecodeAddress(
    const std::string& confidential_address,
    const std::vector<AddressFormatData>& prefix_list) {
  std::vector<uint8_t> pubkey_data(Pubkey::kCompressedPubkeySize);
  std::string address;
  char* output = nullptr;

  if (confidential_address.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. confidential address empty."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError, "DecodeAddress confidential address empty.");
  }

  int ret = -1;
  uint32_t prefix = 0;
  std::string hrp;
  bool is_find_blinded_prefix = false;
  for (const auto& data : prefix_list) {
    for (const auto& format : GetBlindKeyPair()) {
      try {
        output = nullptr;

        // Get confidential_key
        if (format.is_segwit) {
          hrp = data.GetString(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_segwit_to_ec_public_key(
              confidential_address.c_str(), hrp.c_str(), pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret, hrp);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        } else {
          prefix = data.GetValue(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_to_ec_public_key(
              confidential_address.c_str(), prefix, pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        }

        if (ret != WALLY_OK) {
          // do nothing
        } else if (format.is_segwit) {
          ret = wally_confidential_addr_to_addr_segwit(
              confidential_address.c_str(), hrp.c_str(),
              data.GetString(format.prefix_key).c_str(), &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                data.GetString(format.prefix_key).c_str());
          }
        } else {
          ret = wally_confidential_addr_to_addr(
              confidential_address.c_str(), prefix, &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
          }
        }

        if (ret == WALLY_OK) {
          address = WallyUtil::ConvertStringAndFree(output);
          unblinded_address_ = Address(address, data);
          confidential_key_ = ConfidentialKey(ByteData(pubkey_data));
          address_ = confidential_address;
          return;
        }
      } catch (const CfdException& except) {
        // Ignore
        trace(
            CFD_LOG_SOURCE, "DecodeAddress exception={}",
            std::string(except.what()));
      }
    }
  }

  if (is_find_blinded_prefix) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not found."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not found.");
  } else {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not registed."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not registed.");
  }
}